

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O1

bool __thiscall mocker::DominatorTree::isDominating(DominatorTree *this,size_t u,size_t v)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  mapped_type *pmVar3;
  ulong uVar4;
  __hash_code __code;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  bool bVar7;
  size_t local_10;
  
  local_10 = u;
  pmVar3 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->dominating,&local_10);
  uVar1 = (pmVar3->_M_h)._M_bucket_count;
  uVar4 = v % uVar1;
  p_Var5 = (pmVar3->_M_h)._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)v)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var2[1]._M_nxt == (_Hash_node_base *)v)) goto LAB_00155b51;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00155b51:
  if (p_Var6 == (__node_base_ptr)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = p_Var6->_M_nxt != (_Hash_node_base *)0x0;
  }
  return bVar7;
}

Assistant:

bool DominatorTree::isDominating(std::size_t u, std::size_t v) const {
  return isIn(dominating.at(u), v);
}